

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,double kappa,double delta,double theta)

{
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar1;
  int r_size;
  int *piVar2;
  _Head_base<0UL,_int_*,_false> _Var3;
  bool bVar4;
  int iVar5;
  rc_data *__first;
  long lVar6;
  rc_data *__last;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if ((first->current)._M_current == (last->current)._M_current) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      k = (first->current)._M_current[-1];
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar6 = *(long *)(this + 0x50);
        _Var3._M_head_impl = local_38._M_head_impl;
        do {
          *(double *)(lVar6 + (long)*_Var3._M_head_impl * 8) =
               theta * *(double *)(lVar6 + (long)*_Var3._M_head_impl * 8);
          _Var3._M_head_impl = _Var3._M_head_impl + 8;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var3._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      r_size = solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                           *)this,(row_iterator)local_38._M_head_impl,
                          (row_iterator)
                          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      if (1 < r_size) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __first = *(rc_data **)(this + 0x58);
        lVar6 = (long)r_size;
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar6,(int)LZCOUNT(lVar6) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar6);
        __last = __first + 1;
        lVar6 = lVar6 * 0x10 + -0x10;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar6 = lVar6 + -0x10;
        } while (lVar6 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      iVar5 = *(int *)(*(long *)(this + 0x60) + (long)k * 4);
      if (r_size < iVar5) {
        iVar5 = r_size;
      }
      bVar1 = affect<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                        ((solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                          *)this,x,(row_value *)local_38._M_head_impl,k,iVar5 + -1,r_size,kappa,
                         delta);
      bVar4 = (bool)(bVar4 | bVar1);
      piVar2 = (first->current)._M_current + -1;
      (first->current)._M_current = piVar2;
    } while (piVar2 != (last->current)._M_current);
  }
  return bVar4;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }